

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O2

void __thiscall libsgp4::Tle::ExtractExponential(Tle *this,string *str,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  TleException *pTVar4;
  char *pcVar5;
  char cVar6;
  string temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  pcVar3 = (str->_M_dataplus)._M_p;
  pcVar5 = pcVar3;
  do {
    if (pcVar5 == pcVar3 + str->_M_string_length) {
      bVar2 = Util::FromString<double>(&temp,val);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&temp);
        return;
      }
      pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(pTVar4,"Failed to convert value to double");
      __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar6 = (char)&temp;
    if (pcVar5 == pcVar3) {
      cVar1 = *pcVar5;
      if ((cVar1 != ' ') && (cVar1 != '+')) {
        if (cVar1 != '-') {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid sign");
          goto LAB_001092d0;
        }
        std::__cxx11::string::push_back(cVar6);
      }
      std::__cxx11::string::push_back(cVar6);
    }
    else {
      cVar1 = *pcVar5;
      if (pcVar5 == pcVar3 + str->_M_string_length + -2) {
        if ((cVar1 != '-') && (cVar1 != '+')) {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid exponential sign");
          goto LAB_001092d0;
        }
        std::__cxx11::string::push_back(cVar6);
      }
      else if (9 < (int)cVar1 - 0x30U) {
        pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(pTVar4,"Invalid digit");
LAB_001092d0:
        __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::push_back(cVar6);
    pcVar5 = pcVar5 + 1;
    pcVar3 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void Tle::ExtractExponential(const std::string& str, double& val)
{
    std::string temp;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        if (i == str.begin())
        {
            if (*i == '-' || *i == '+' || *i == ' ')
            {
                if (*i == '-')
                {
                    temp += *i;
                }
                temp += '0';
                temp += '.';
            }
            else
            {
                throw TleException("Invalid sign");
            }
        }
        else if (i == str.end() - 2)
        {
            if (*i == '-' || *i == '+')
            {
                temp += 'e';
                temp += *i;
            }
            else
            {
                throw TleException("Invalid exponential sign");
            }
        }
        else
        {
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}